

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::SetRawReissueAsset
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
          *issuances,
          vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
          *issuance_output)

{
  pointer *txid;
  pointer pTVar1;
  ConfidentialNonce *object;
  ByteData nonce;
  IssuanceParameter issuance_param;
  IssuanceOutput output;
  Script locking_script;
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  pTVar1 = (issuances->
           super__Vector_base<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  object = &(((issuances->
              super__Vector_base<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
              )._M_impl.super__Vector_impl_data._M_start)->asset_txout).nonce_;
  while (txid = &object[-6].data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, (pointer)txid != pTVar1) {
    core::AbstractTxOut::GetLockingScript(&locking_script,(AbstractTxOut *)(object + -4));
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&output,object);
    core::ConfidentialNonce::GetData(&nonce,(ConfidentialNonce *)&output);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&output);
    ConfidentialTransactionController::SetAssetReissuance
              (&issuance_param,__return_storage_ptr__,(Txid *)txid,
               *(uint32_t *)
                &object[-5].data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (Amount *)
               &object[-5].data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&locking_script,&nonce,
               (BlindFactor *)&object[2].data_,(BlindFactor *)(object + 3),false,false);
    if (issuance_output !=
        (vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)0x0) {
      IssuanceOutput::IssuanceOutput(&output);
      core::Txid::operator=(&output.txid,(Txid *)txid);
      output.vout = *(uint32_t *)
                     &object[-5].data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
      core::ConfidentialAssetId::operator=(&output.output.asset,&issuance_param.asset);
      core::BlindFactor::operator=(&output.output.entropy,&issuance_param.entropy);
      std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::push_back
                (issuance_output,&output);
      IssuanceOutput::~IssuanceOutput(&output);
    }
    core::IssuanceParameter::~IssuanceParameter(&issuance_param);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce);
    core::Script::~Script(&locking_script);
    object = (ConfidentialNonce *)&object[9].data_;
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::SetRawReissueAsset(
    const std::string& tx_hex,
    const std::vector<TxInReissuanceParameters>& issuances,
    std::vector<IssuanceOutput>* issuance_output) {
  ConfidentialTransactionController ctxc(tx_hex);

  for (const auto& issuance : issuances) {
    Script locking_script = issuance.asset_txout.GetLockingScript();
    ByteData nonce = issuance.asset_txout.GetNonce().GetData();

    IssuanceParameter issuance_param = ctxc.SetAssetReissuance(
        issuance.txid, issuance.vout, issuance.amount, locking_script, nonce,
        issuance.blind_factor, issuance.entropy, false);

    if (issuance_output != nullptr) {
      IssuanceOutput output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.output.asset = issuance_param.asset;
      output.output.entropy = issuance_param.entropy;
      issuance_output->push_back(output);
    }
  }
  return ctxc;
}